

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O2

int KINSetRelErrFunc(void *kinmem,sunrealtype relfunc)

{
  double __x;
  int line;
  int error_code;
  char *msgfmt;
  double dVar1;
  
  if (kinmem == (void *)0x0) {
    msgfmt = "kinsol_mem = NULL illegal.";
    kinmem = (KINMem)0x0;
    error_code = -1;
    line = 0x2c3;
  }
  else {
    dVar1 = 0.0;
    if (0.0 <= relfunc) {
      if ((relfunc != 0.0) || (NAN(relfunc))) {
        if (relfunc < 0.0) {
          dVar1 = sqrt(relfunc);
        }
        else {
          dVar1 = SQRT(relfunc);
        }
        *(double *)((long)kinmem + 0x88) = dVar1;
      }
      else {
        __x = *(double *)((long)kinmem + 8);
        if (0.0 < __x) {
          if (__x < 0.0) {
            dVar1 = sqrt(__x);
          }
          else {
            dVar1 = SQRT(__x);
          }
        }
        *(double *)((long)kinmem + 0x88) = dVar1;
      }
      return 0;
    }
    msgfmt = "relfunc < 0 illegal.";
    error_code = -2;
    line = 0x2cb;
  }
  KINProcessError((KINMem)kinmem,error_code,line,"KINSetRelErrFunc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_io.c"
                  ,msgfmt);
  return error_code;
}

Assistant:

int KINSetRelErrFunc(void* kinmem, sunrealtype relfunc)
{
  KINMem kin_mem;
  sunrealtype uround;

  if (kinmem == NULL)
  {
    KINProcessError(NULL, KIN_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (KIN_MEM_NULL);
  }

  kin_mem = (KINMem)kinmem;

  if (relfunc < ZERO)
  {
    KINProcessError(kin_mem, KIN_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_BAD_RELFUNC);
    return (KIN_ILL_INPUT);
  }

  if (relfunc == ZERO)
  {
    uround                    = kin_mem->kin_uround;
    kin_mem->kin_sqrt_relfunc = SUNRsqrt(uround);
  }
  else { kin_mem->kin_sqrt_relfunc = SUNRsqrt(relfunc); }

  return (KIN_SUCCESS);
}